

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeBenchmark.cpp
# Opt level: O3

void __thiscall TreeBenchmark::TreeBenchmark(TreeBenchmark *this,unsigned_long vertices)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  bool bVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *__new_size;
  _List_node_base *p_Var6;
  long lVar7;
  pair<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_bool>
  pVar8;
  AdjList *g;
  back_insertion_sequence_tag local_68;
  stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>
  local_60;
  StoredVertexList *local_50;
  long local_48;
  _List_node_base *local_40;
  DynamicGraph *local_38;
  
  (this->super_Benchmark)._vptr_Benchmark = (_func_int **)&PTR_getDeletionsTime_00120c48;
  local_38 = &(this->super_Benchmark).G;
  boost::
  adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>
  ::adjacency_list(&local_38->super_UndirectedGraph,(no_property *)&local_60);
  p_Var1 = &(this->super_Benchmark).G.virtualEdges._M_t._M_impl.super__Rb_tree_header;
  (this->super_Benchmark).G.virtualEdges._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_Benchmark).G.virtualEdges._M_t._M_impl.super__Rb_tree_header._M_header + 8)
       = (_Base_ptr)0x0;
  (this->super_Benchmark).G.components.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_Benchmark).G.components.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_Benchmark).G.components.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_Benchmark).G.level.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Benchmark).G.level.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Benchmark).G.level.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_Benchmark).G.virtualEdges._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_Benchmark).G.virtualEdges._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_Benchmark).G.virtualEdges._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_Benchmark).G.nextComponent = 0;
  (this->super_Benchmark).G.relatives.super__Vector_base<Relatives,_std::allocator<Relatives>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Benchmark).G.relatives.super__Vector_base<Relatives,_std::allocator<Relatives>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->super_Benchmark).G.relatives.
           super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.super__Vector_impl_data
           ._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->super_Benchmark).G.relatives.
           super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage + 2) = 0;
  (this->super_Benchmark)._vptr_Benchmark = (_func_int **)&PTR_getDeletionsTime_00120ce8;
  if (vertices != 0) {
    local_50 = &(this->super_Benchmark).G.super_UndirectedGraph.super_type.m_vertices;
    local_48 = 0x20;
    lVar7 = 0;
    p_Var5 = (_List_node_base *)0x0;
    __new_size = (_List_node_base *)0x3;
    local_40 = (_List_node_base *)vertices;
    do {
      p_Var6 = (_List_node_base *)((long)&__new_size[-1]._M_prev + 6);
      if ((_List_node_base *)
          ((long)*(pointer *)
                  ((long)&(this->super_Benchmark).G.super_UndirectedGraph.super_type.m_vertices.
                          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                          ._M_impl + 8) -
           (long)(this->super_Benchmark).G.super_UndirectedGraph.super_type.m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5) <= p_Var6) {
        std::
        vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
        ::resize(local_50,(size_type)((long)&__new_size[-1]._M_prev + 7));
      }
      p_Var4 = (_List_node_base *)operator_new(0x28);
      p_Var4[1]._M_next = p_Var5;
      p_Var4[1]._M_prev = p_Var6;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar2 = (size_t *)
               ((long)&(this->super_Benchmark).G.super_UndirectedGraph.super_type.m_edges.
                       super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                       ._M_impl + 0x10);
      *psVar2 = *psVar2 + 1;
      p_Var4 = *(_List_node_base **)
                ((long)&(this->super_Benchmark).G.super_UndirectedGraph.super_type.m_edges.
                        super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                        ._M_impl + 8);
      local_68 = (back_insertion_sequence_tag)&Action::vtable;
      local_60.super_stored_edge<unsigned_long>.m_target = (unsigned_long)p_Var6;
      local_60.m_iter._M_node = p_Var4;
      pVar8 = boost::graph_detail::
              push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                        ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                          *)((long)&(((this->super_Benchmark).G.super_UndirectedGraph.super_type.
                                      m_vertices.
                                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->super_StoredVertex
                                    ).m_out_edges.
                                    super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                            + lVar7),&local_60,&local_68);
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        psVar2 = (size_t *)
                 ((long)&(this->super_Benchmark).G.super_UndirectedGraph.super_type.m_edges.
                         super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                         ._M_impl + 0x10);
        *psVar2 = *psVar2 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var4,0x28);
      }
      else {
        local_68 = (back_insertion_sequence_tag)&Action::vtable;
        local_60.super_stored_edge<unsigned_long>.m_target = (unsigned_long)p_Var5;
        local_60.m_iter._M_node = p_Var4;
        boost::graph_detail::
        push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                  ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                    *)((long)&(((local_50->
                                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                                )._M_impl.super__Vector_impl_data._M_start)->super_StoredVertex).
                              m_out_edges.
                              super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      + local_48),&local_60,&local_68);
      }
      p_Var6 = (_List_node_base *)((long)&__new_size[-1]._M_prev + 7);
      if (local_40 < p_Var6) {
        return;
      }
      if ((_List_node_base *)
          ((long)*(pointer *)
                  ((long)&(this->super_Benchmark).G.super_UndirectedGraph.super_type.m_vertices.
                          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                          ._M_impl + 8) -
           (long)(this->super_Benchmark).G.super_UndirectedGraph.super_type.m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5) <= p_Var6) {
        std::
        vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
        ::resize(local_50,(size_type)__new_size);
      }
      p_Var4 = (_List_node_base *)operator_new(0x28);
      p_Var4[1]._M_next = p_Var5;
      p_Var4[1]._M_prev = p_Var6;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar2 = (size_t *)
               ((long)&(this->super_Benchmark).G.super_UndirectedGraph.super_type.m_edges.
                       super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                       ._M_impl + 0x10);
      *psVar2 = *psVar2 + 1;
      p_Var4 = *(_List_node_base **)
                ((long)&(this->super_Benchmark).G.super_UndirectedGraph.super_type.m_edges.
                        super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                        ._M_impl + 8);
      local_68 = (back_insertion_sequence_tag)&Action::vtable;
      local_60.super_stored_edge<unsigned_long>.m_target = (unsigned_long)p_Var6;
      local_60.m_iter._M_node = p_Var4;
      pVar8 = boost::graph_detail::
              push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                        ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                          *)((long)&(((this->super_Benchmark).G.super_UndirectedGraph.super_type.
                                      m_vertices.
                                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->super_StoredVertex
                                    ).m_out_edges.
                                    super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                            + lVar7),&local_60,&local_68);
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        psVar2 = (size_t *)
                 ((long)&(this->super_Benchmark).G.super_UndirectedGraph.super_type.m_edges.
                         super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                         ._M_impl + 0x10);
        *psVar2 = *psVar2 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var4,0x28);
      }
      else {
        local_68 = (back_insertion_sequence_tag)&Action::vtable;
        local_60.super_stored_edge<unsigned_long>.m_target = (unsigned_long)p_Var5;
        local_60.m_iter._M_node = p_Var4;
        boost::graph_detail::
        push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                  ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                    *)((long)&(local_50->
                              super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                              )._M_impl.super__Vector_impl_data._M_start[1].super_StoredVertex.
                              m_out_edges.
                              super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      + local_48),&local_60,&local_68);
      }
      p_Var5 = (_List_node_base *)((long)&p_Var5->_M_next + 1);
      local_48 = local_48 + 0x40;
      lVar7 = lVar7 + 0x20;
      bVar3 = __new_size <= local_40;
      __new_size = (_List_node_base *)((long)&__new_size->_M_next + 2);
    } while (bVar3);
  }
  return;
}

Assistant:

TreeBenchmark::TreeBenchmark(unsigned long vertices)
{
    int offset = 1;
    for (Vertex i=0; i<=vertices; ++i) {
        if (offset+i > vertices) {
            break;
        }
        add_edge(i, i+offset, G);
        offset++;
        if (offset+i > vertices) {
            break;
        }
        add_edge(i, i+offset, G);
    }
}